

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

Am_String Am_Show_File_Dialog_For_Open(Am_String *initial_value)

{
  bool bVar1;
  Am_Value_List *list;
  Am_String *in_RSI;
  Am_String local_60 [3];
  Am_Value_List local_48;
  Am_Value_List local_38;
  undefined1 local_28 [8];
  Am_Value v;
  Am_String *initial_value_local;
  
  Am_Value_List::Am_Value_List(&local_48);
  list = Am_Value_List::Add(&local_48,"Type filename for Read:",Am_TAIL,true);
  Am_Value_List::Am_Value_List(&local_38,list);
  Am_String::Am_String(local_60,in_RSI);
  Am_Get_Input_From_Dialog
            ((Am_Value_List *)local_28,(Am_String *)&local_38,(int)local_60,-10000,true);
  Am_String::~Am_String(local_60);
  Am_Value_List::~Am_Value_List(&local_38);
  Am_Value_List::~Am_Value_List(&local_48);
  bVar1 = Am_Value::Valid((Am_Value *)local_28);
  if (bVar1) {
    Am_String::Am_String(initial_value,(Am_Value *)local_28);
  }
  else {
    Am_String::Am_String(initial_value,"",true);
  }
  Am_Value::~Am_Value((Am_Value *)local_28);
  return (Am_String)(Am_String_Data *)initial_value;
}

Assistant:

Am_String
Am_Show_File_Dialog_For_Open(Am_String initial_value)
{
  Am_Value v = Am_Get_Input_From_Dialog(
      Am_Value_List().Add("Type filename for Read:"), initial_value);
  if (v.Valid())
    return v;
  else
    return "";
}